

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void stack_head_delete(StackHead *self,StackNodeArray *pool,SubtreePool *subtree_pool)

{
  if (self->node != (StackNode *)0x0) {
    if ((self->last_external_token).ptr != (SubtreeHeapData *)0x0) {
      ts_subtree_release(subtree_pool,self->last_external_token);
    }
    if (self->summary != (StackSummary *)0x0) {
      array__delete((VoidArray *)self->summary);
      free(self->summary);
    }
    stack_node_release(self->node,pool,subtree_pool);
    return;
  }
  return;
}

Assistant:

static void stack_head_delete(StackHead *self, StackNodeArray *pool, SubtreePool *subtree_pool) {
  if (self->node) {
    if (self->last_external_token.ptr) {
      ts_subtree_release(subtree_pool, self->last_external_token);
    }
    if (self->summary) {
      array_delete(self->summary);
      ts_free(self->summary);
    }
    stack_node_release(self->node, pool, subtree_pool);
  }
}